

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidget::setFeatures(QDockWidget *this,DockWidgetFeatures features)

{
  uint uVar1;
  QDockWidgetPrivate *this_00;
  bool bVar2;
  WindowStates states;
  QLayout *object;
  QDockWidgetLayout *this_01;
  QDockWidgetGroupWindow *this_02;
  long in_FS_OFFSET;
  QRect local_48;
  WindowState local_38 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDockWidgetPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
          super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i;
  if (uVar1 != ((uint)features.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                      super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 0xf)) {
    (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
    super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
         (uint)features.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
               super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 0xf;
    object = QWidget::layout(&this->super_QWidget);
    this_01 = QtPrivate::qobject_cast_helper<QDockWidgetLayout*,QObject>(&object->super_QObject);
    QDockWidgetLayout::setVerticalTitleBar
              (this_01,SUB41(((uint)features.
                                    super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                                    super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 8) >> 3,
                             0));
    QDockWidgetPrivate::updateButtons(this_00);
    QAction::setEnabled(SUB81(this_00->toggleViewAction,0));
    featuresChanged(this,(DockWidgetFeatures)
                         (this_00->features).
                         super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                         super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i);
    QWidget::update(&this->super_QWidget);
    if (((uVar1 ^ (uint)features.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                        super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i) & 1) != 0) {
      bVar2 = QDockWidgetLayout::nativeWindowDeco(this_01);
      if (bVar2) {
        this_02 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                            (*(QObject **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
        if ((this_02 != (QDockWidgetGroupWindow *)0x0) &&
           (((((this->super_QWidget).data)->window_flags).
             super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i & 1)
            == 0)) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            QDockWidgetGroupWindow::adjustFlags((QDockWidgetGroupWindow *)this_02);
            return;
          }
          goto LAB_003d73d9;
        }
        local_38[0] = Floating;
        local_38[1] = Unplug;
        states.super_QFlagsStorageHelper<QDockWidgetPrivate::WindowState,_4>.
        super_QFlagsStorage<QDockWidgetPrivate::WindowState>.i =
             (QFlagsStorageHelper<QDockWidgetPrivate::WindowState,_4>)
             QFlags<QDockWidgetPrivate::WindowState>::initializer_list_helper
                       (local_38,(const_iterator)&local_30);
        local_48.x1.m_i = 0;
        local_48.y1.m_i = 0;
        local_48.x2.m_i = -1;
        local_48.y2.m_i = -1;
        QDockWidgetPrivate::setWindowState(this_00,states,&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003d73d9:
  __stack_chk_fail();
}

Assistant:

void QDockWidget::setFeatures(QDockWidget::DockWidgetFeatures features)
{
    Q_D(QDockWidget);
    features &= DockWidgetFeatureMask;
    if (d->features == features)
        return;
    const bool closableChanged = (d->features ^ features) & DockWidgetClosable;
    d->features = features;
    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(this->layout());
    layout->setVerticalTitleBar(features & DockWidgetVerticalTitleBar);
    d->updateButtons();
    d->toggleViewAction->setEnabled((d->features & DockWidgetClosable) == DockWidgetClosable);
    emit featuresChanged(d->features);
    update();
    if (closableChanged && layout->nativeWindowDeco()) {
        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow *>(parent());
        if (floatingTab && !isFloating()) {
            floatingTab->adjustFlags();
        } else {
            d->setWindowState({QDockWidgetPrivate::WindowState::Floating,
                               QDockWidgetPrivate::WindowState::Unplug});
        }
    }
}